

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdClient.hpp
# Opt level: O0

detail * __thiscall Statsd::detail::sanitizePrefix(detail *this,string *prefix)

{
  ulong uVar1;
  char *pcVar2;
  string *prefix_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 == '.') {
      std::__cxx11::string::pop_back();
    }
  }
  std::__cxx11::string::string((string *)this,(string *)prefix);
  return this;
}

Assistant:

inline std::string sanitizePrefix(std::string prefix) {
    // For convenience we provide the dot when generating the stat message
    if (!prefix.empty() && prefix.back() == '.') {
        prefix.pop_back();
    }
    return prefix;
}